

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
operator>>(unsigned_long lhs,
          SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> bits
          )

{
  if (bits.m_int < 0) {
    __assert_fail("!std::numeric_limits< T >::is_signed || (T)bits >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                  ,0x1b13,
                  "SafeInt<U, E> operator>>(U, SafeInt<T, E>) [T = long, U = unsigned long, E = safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>]"
                 );
  }
  if ((ulong)bits.m_int < 0x40) {
    return (SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
            )(lhs >> ((byte)bits.m_int & 0x3f));
  }
  __assert_fail("(T)bits < (int)safeint_internal::int_traits< U >::bitCount",
                "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                ,0x1b14,
                "SafeInt<U, E> operator>>(U, SafeInt<T, E>) [T = long, U = unsigned long, E = safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>]"
               );
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< U, E > operator >>( U lhs, SafeInt< T, E > bits ) SAFEINT_NOTHROW
{
    ShiftAssert( !std::numeric_limits< T >::is_signed || (T)bits >= 0 );
    ShiftAssert( (T)bits < (int)safeint_internal::int_traits< U >::bitCount );

    return SafeInt< U, E >( (U)( lhs >> (T)bits ) );
}